

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetDowngradedClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  undefined1 in_CL;
  Descriptor *descriptor_00;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  FileJavaPackage_abi_cxx11_(&local_40,*(java **)(descriptor + 0x10),(FileDescriptor *)descriptor);
  std::operator+(&local_a0,&local_40,".");
  GetDowngradedFileClassName_abi_cxx11_(&local_c0,this,*(FileDescriptor **)(descriptor + 0x10));
  std::operator+(&local_80,&local_a0,&local_c0);
  std::operator+(&local_60,&local_80,".");
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_e0,(_anonymous_namespace_ *)descriptor,descriptor_00,(bool)in_CL);
  std::operator+(__return_storage_ptr__,&local_60,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetDowngradedClassName(
    const Descriptor* descriptor) {
  return FileJavaPackage(descriptor->file()) + "." +
         GetDowngradedFileClassName(descriptor->file()) + "." +
         ClassNameWithoutPackage(descriptor, false);
}